

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
eglu::toLegacyAttribList
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,EGLAttrib *attribs)

{
  ulong uVar1;
  InternalError *this;
  ulong uVar2;
  int *piVar3;
  iterator iVar4;
  ulong *puVar5;
  int local_2c;
  int local_28;
  int local_24;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((attribs == (EGLAttrib *)0x0) || (uVar1 = *attribs, uVar1 == 0x3038)) {
    iVar4._M_current = (int *)0x0;
  }
  else {
    puVar5 = (ulong *)(attribs + 1);
    do {
      if ((uVar1 >> 0x20 != 0) || (uVar2 = *puVar5, uVar2 >> 0x20 != 0)) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this,"Failed to translate EGLAttrib to EGLint",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0x1ac);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      local_24 = (int)uVar1;
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (iVar4._M_current == piVar3) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar4,&local_24);
        uVar2 = *puVar5;
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar4._M_current = local_24;
        iVar4._M_current = iVar4._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current;
      }
      local_28 = (int)uVar2;
      if (iVar4._M_current == piVar3) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar4,&local_28);
      }
      else {
        *iVar4._M_current = local_28;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      uVar1 = puVar5[1];
      puVar5 = puVar5 + 2;
    } while (uVar1 != 0x3038);
    iVar4._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current !=
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *iVar4._M_current = 0x3038;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      return __return_storage_ptr__;
    }
  }
  local_2c = 0x3038;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (__return_storage_ptr__,iVar4,&local_2c);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> toLegacyAttribList (const EGLAttrib* attribs)
{
	const deUint64	attribMask		= 0xffffffffull;	//!< Max bits that can be used
	vector<EGLint>	legacyAttribs;

	if (attribs)
	{
		for (const EGLAttrib* attrib = attribs; *attrib != EGL_NONE; attrib += 2)
		{
			if ((attrib[0] & ~attribMask) || (attrib[1] & ~attribMask))
				throw tcu::InternalError("Failed to translate EGLAttrib to EGLint", DE_NULL, __FILE__, __LINE__);

			legacyAttribs.push_back((EGLint)attrib[0]);
			legacyAttribs.push_back((EGLint)attrib[1]);
		}
	}

	legacyAttribs.push_back(EGL_NONE);

	return legacyAttribs;
}